

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O0

void cjson_set_number_value_should_set_numbers(void)

{
  long lVar1;
  double dVar2;
  long in_FS_OFFSET;
  undefined1 auStack_58 [8];
  cJSON number [1];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  number[0].valueint = 0;
  number[0]._44_4_ = 0;
  number[0].valuedouble = 0.0;
  number[0].type = 0;
  number[0]._28_4_ = 0;
  number[0].valuestring = (char *)0x0;
  number[0].prev = (cJSON *)0x0;
  auStack_58 = (undefined1  [8])0x0;
  number[0].next = (cJSON *)0x0;
  number[0].child = (cJSON *)0x8;
  dVar2 = cJSON_SetNumberHelper((cJSON *)auStack_58,1.5);
  UnityAssertEqualNumber(SUB84(dVar2,0),1,(long)(int)number[0].valuestring,0,0xcd);
  UnityAssertDoublesWithin(0x41c4df1a,0x3ff8000000000000,number[0]._40_8_,0,0xce);
  dVar2 = cJSON_SetNumberHelper((cJSON *)auStack_58,-1.5);
  UnityAssertEqualNumber
            (SUB84(dVar2,0),0xffffffffffffffff,(long)(int)number[0].valuestring,0,0xd1,0x14);
  UnityAssertDoublesWithin(0x41c4df1a,0xbff8000000000000,number[0]._40_8_,0,0xd2);
  dVar2 = cJSON_SetNumberHelper((cJSON *)auStack_58,2147483648.0);
  UnityAssertEqualNumber(SUB84(dVar2,0),0x7fffffff,(long)(int)number[0].valuestring,0,0xd5,0x14);
  UnityAssertDoublesWithin(0x812dea11,0x41e0000000000000,number[0]._40_8_,0,0xd6);
  dVar2 = cJSON_SetNumberHelper((cJSON *)auStack_58,-2147483649.0);
  UnityAssertEqualNumber
            (SUB84(dVar2,0),0xffffffff80000000,(long)(int)number[0].valuestring,0,0xd9,0x14);
  UnityAssertDoublesWithin(0x81511944,0xc1e0000000200000,number[0]._40_8_,0,0xda);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void cjson_set_number_value_should_set_numbers(void)
{
    cJSON number[1] = {{NULL, NULL, NULL, cJSON_Number, NULL, 0, 0, NULL}};

    cJSON_SetNumberValue(number, 1.5);
    TEST_ASSERT_EQUAL(1, number->valueint);
    TEST_ASSERT_EQUAL_DOUBLE(1.5, number->valuedouble);

    cJSON_SetNumberValue(number, -1.5);
    TEST_ASSERT_EQUAL(-1, number->valueint);
    TEST_ASSERT_EQUAL_DOUBLE(-1.5, number->valuedouble);

    cJSON_SetNumberValue(number, 1 + (double)INT_MAX);
    TEST_ASSERT_EQUAL(INT_MAX, number->valueint);
    TEST_ASSERT_EQUAL_DOUBLE(1 + (double)INT_MAX, number->valuedouble);

    cJSON_SetNumberValue(number, -1 + (double)INT_MIN);
    TEST_ASSERT_EQUAL(INT_MIN, number->valueint);
    TEST_ASSERT_EQUAL_DOUBLE(-1 + (double)INT_MIN, number->valuedouble);
}